

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

cstr idx2::ToRawFileName(metadata *Meta)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *pcVar3;
  long *in_FS_OFFSET;
  stref sVar4;
  printer Pr;
  
  pcVar3 = (char *)(*in_FS_OFFSET + -0x580);
  printer::printer(&Pr,pcVar3,0x180);
  if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
    if ((long)Pr.Size < 2) {
      pcVar3 = "false && \"buffer too small\"";
    }
    else {
      iVar1 = snprintf(Pr.Buf,(long)Pr.Size,"%s-",Meta);
      Pr.Buf = Pr.Buf + iVar1;
      iVar2 = Pr.Size - iVar1;
      if (Pr.Size - iVar1 != 0 && iVar1 <= Pr.Size) goto LAB_0010806c;
      pcVar3 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
      fprintf((FILE *)Pr.File,"%s-",Meta);
      iVar2 = Pr.Size;
LAB_0010806c:
      Pr.Size = iVar2;
      if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
        if ((long)Pr.Size < 2) {
          pcVar3 = "false && \"buffer too small\"";
        }
        else {
          iVar1 = snprintf(Pr.Buf,(long)Pr.Size,"%s-",Meta->Field);
          Pr.Buf = Pr.Buf + iVar1;
          iVar2 = Pr.Size - iVar1;
          if (Pr.Size - iVar1 != 0 && iVar1 <= Pr.Size) goto LAB_001080f0;
          pcVar3 = "false && \"buffer overflow?\"";
        }
      }
      else {
        if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
          fprintf((FILE *)Pr.File,"%s-",Meta->Field);
          iVar2 = Pr.Size;
LAB_001080f0:
          Pr.Size = iVar2;
          if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
            if ((long)Pr.Size < 2) {
              pcVar3 = "false && \"buffer too small\"";
            }
            else {
              iVar1 = snprintf(Pr.Buf,(long)Pr.Size,"[%d-%d-%d]-",
                               (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                               (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                               (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
              Pr.Buf = Pr.Buf + iVar1;
              iVar2 = Pr.Size - iVar1;
              if (Pr.Size - iVar1 != 0 && iVar1 <= Pr.Size) goto LAB_00108189;
              pcVar3 = "false && \"buffer overflow?\"";
            }
          }
          else {
            if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
              fprintf((FILE *)Pr.File,"[%d-%d-%d]-",(ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                      (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                      (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
              iVar2 = Pr.Size;
LAB_00108189:
              Pr.Size = iVar2;
              sVar4 = ToString(Meta->DType);
              if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
                if ((long)Pr.Size < 2) {
                  pcVar3 = "false && \"buffer too small\"";
                }
                else {
                  iVar2 = snprintf(Pr.Buf,(long)Pr.Size,"%.*s",sVar4._8_8_ & 0xffffffff,
                                   sVar4.field_0.Ptr);
                  Pr.Buf = Pr.Buf + iVar2;
                  if (iVar2 < Pr.Size) {
                    return pcVar3;
                  }
                  pcVar3 = "false && \"buffer overflow?\"";
                }
              }
              else {
                if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
                  fprintf((FILE *)Pr.File,"%.*s",sVar4._8_8_ & 0xffffffff,sVar4.field_0.Ptr);
                  return pcVar3;
                }
                pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
              }
              __line = 0x1a;
              goto LAB_001082c6;
            }
            pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
          }
          __line = 0x18;
          goto LAB_001082c6;
        }
        pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
      }
      __line = 0x17;
      goto LAB_001082c6;
    }
    pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __line = 0x16;
LAB_001082c6:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                ,__line,"cstr idx2::ToRawFileName(const metadata &)");
}

Assistant:

cstr
ToRawFileName(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "%s-", Meta.Name);
  idx2_Print(&Pr, "%s-", Meta.Field);
  idx2_Print(&Pr, "[%d-%d-%d]-", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "%.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}